

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::get_vertex_attrib_pointerv
               (NegativeTestContext *ctx)

{
  GLvoid *this [1];
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  GLuint local_1c;
  void *pvStack_18;
  GLint maxVertexAttribs;
  GLvoid *ptr [1];
  NegativeTestContext *ctx_local;
  
  pvStack_18 = (void *)0x0;
  ptr[0] = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"GL_INVALID_ENUM is generated if pname is not an accepted value.",
             &local_41);
  NegativeTestContext::beginSection(ctx,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  glu::CallLogWrapper::glGetVertexAttribPointerv
            ((CallLogWrapper *)ptr[0],0,0xffffffff,&stack0xffffffffffffffe8);
  NegativeTestContext::expectError((NegativeTestContext *)ptr[0],0x500);
  NegativeTestContext::endSection((NegativeTestContext *)ptr[0]);
  this[0] = ptr[0];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "GL_INVALID_VALUE is generated if index is greater than or equal to GL_MAX_VERTEX_ATTRIBS."
             ,&local_79);
  NegativeTestContext::beginSection((NegativeTestContext *)this[0],&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  glu::CallLogWrapper::glGetIntegerv((CallLogWrapper *)ptr[0],0x8869,(GLint *)&local_1c);
  glu::CallLogWrapper::glGetVertexAttribPointerv
            ((CallLogWrapper *)ptr[0],local_1c,0x8645,&stack0xffffffffffffffe8);
  NegativeTestContext::expectError((NegativeTestContext *)ptr[0],0x501);
  NegativeTestContext::endSection((NegativeTestContext *)ptr[0]);
  return;
}

Assistant:

void get_vertex_attrib_pointerv (NegativeTestContext& ctx)
{
	GLvoid*	ptr[1]				= { DE_NULL };
	GLint	maxVertexAttribs;

	ctx.beginSection("GL_INVALID_ENUM is generated if pname is not an accepted value.");
	ctx.glGetVertexAttribPointerv(0, -1, &ptr[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if index is greater than or equal to GL_MAX_VERTEX_ATTRIBS.");
	ctx.glGetIntegerv(GL_MAX_VERTEX_ATTRIBS, &maxVertexAttribs);
	ctx.glGetVertexAttribPointerv(maxVertexAttribs, GL_VERTEX_ATTRIB_ARRAY_POINTER, &ptr[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();
}